

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O0

ForNonStreamable<std::__exception_ptr::exception_ptr,_std::string> *
lest::make_string<std::__exception_ptr::exception_ptr>
          (ForNonStreamable<std::__exception_ptr::exception_ptr,_std::string>
           *__return_storage_ptr__,exception_ptr *item)

{
  exception_ptr *item_local;
  
  make_enum_string<std::__exception_ptr::exception_ptr>(__return_storage_ptr__,item);
  return __return_storage_ptr__;
}

Assistant:

auto make_string( T const & item ) -> ForNonStreamable<T, std::string>
{
    return make_enum_string( item );
}